

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtConvexConcaveCollisionAlgorithm::processCollision
          (cbtConvexConcaveCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtConvexTriangleCallback *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  cbtCollisionShape *pcVar5;
  cbtTransform *pcVar6;
  cbtPersistentManifold *pcVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  cbtVector3 cVar13;
  bool bVar14;
  int iVar15;
  cbtVector3 *pcVar16;
  long lVar17;
  cbtCollisionObject *pcVar18;
  int v;
  ulong uVar19;
  long lVar20;
  cbtCollisionObject *pcVar21;
  cbtSphereShape *sphere;
  cbtCollisionObjectWrapper *triBodyWrap;
  cbtScalar in_XMM0_Da;
  float fVar22;
  float fVar23;
  CProfileSample __profile;
  cbtScalar dist;
  cbtAlignedObjectArray<cbtVector3> queryVertices;
  cbtVector3 normalLocal;
  cbtVector3 normal;
  cbtVector3 vtx;
  CProfileSample local_ed;
  float local_ec;
  cbtAlignedObjectArray<cbtVector3> local_e8;
  cbtManifoldResult *local_c8;
  cbtVector3 local_bc;
  float local_ac;
  undefined1 local_a8 [16];
  cbtSdfCollisionShape *local_90;
  undefined1 local_88 [8];
  float fStack_80;
  undefined1 local_78 [16];
  cbtVector3 local_68;
  undefined1 local_58 [16];
  undefined1 local_40 [16];
  
  local_a8._8_8_ = local_a8._0_8_;
  local_c8 = resultOut;
  CProfileSample::CProfileSample(&local_ed,"cbtConvexConcaveCollisionAlgorithm::processCollision");
  local_a8._0_8_ = this;
  triBodyWrap = body1Wrap;
  if (this->m_isSwapped != false) {
    triBodyWrap = body0Wrap;
    body0Wrap = body1Wrap;
  }
  local_90 = (cbtSdfCollisionShape *)triBodyWrap->m_shape;
  iVar15 = (local_90->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType;
  if (iVar15 - 0x19U < 0xb) {
    pcVar5 = body0Wrap->m_shape;
    if (iVar15 == 0x23) {
      if (pcVar5->m_shapeType < 0x18) {
        local_e8.m_ownsMemory = true;
        uVar19 = 0;
        local_e8.m_data = (cbtVector3 *)0x0;
        local_e8.m_size = 0;
        local_e8.m_capacity = 0;
        if (pcVar5->m_shapeType < 7) {
          while( true ) {
            iVar15 = (*pcVar5->_vptr_cbtCollisionShape[0x19])(pcVar5);
            if (iVar15 <= (int)uVar19) break;
            (*pcVar5->_vptr_cbtCollisionShape[0x1c])(pcVar5,uVar19,&local_68);
            if (local_e8.m_size == local_e8.m_capacity) {
              iVar15 = local_e8.m_size * 2;
              if (local_e8.m_size == 0) {
                iVar15 = 1;
              }
              if (local_e8.m_capacity < iVar15) {
                if (iVar15 == 0) {
                  pcVar16 = (cbtVector3 *)0x0;
                }
                else {
                  pcVar16 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar15 << 4,0x10);
                }
                if (0 < (long)local_e8.m_size) {
                  lVar17 = 0;
                  do {
                    puVar1 = (undefined8 *)((long)(local_e8.m_data)->m_floats + lVar17);
                    uVar12 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pcVar16->m_floats + lVar17);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar12;
                    lVar17 = lVar17 + 0x10;
                  } while ((long)local_e8.m_size * 0x10 != lVar17);
                }
                if ((local_e8.m_data != (cbtVector3 *)0x0) && (local_e8.m_ownsMemory == true)) {
                  cbtAlignedFreeInternal(local_e8.m_data);
                }
                local_e8.m_ownsMemory = true;
                local_e8.m_capacity = iVar15;
                local_e8.m_data = pcVar16;
              }
            }
            *(undefined8 *)local_e8.m_data[local_e8.m_size].m_floats = local_68.m_floats._0_8_;
            *(undefined8 *)(local_e8.m_data[local_e8.m_size].m_floats + 2) = local_68.m_floats._8_8_
            ;
            local_e8.m_size = local_e8.m_size + 1;
            uVar19 = (ulong)((int)uVar19 + 1);
          }
        }
        if (pcVar5->m_shapeType == 8) {
          if (local_e8.m_size == local_e8.m_capacity) {
            iVar15 = 1;
            if (local_e8.m_size != 0) {
              iVar15 = local_e8.m_size * 2;
            }
            if (local_e8.m_capacity < iVar15) {
              if (iVar15 == 0) {
                pcVar16 = (cbtVector3 *)0x0;
              }
              else {
                pcVar16 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar15 << 4,0x10);
              }
              if (0 < (long)local_e8.m_size) {
                lVar17 = 0;
                do {
                  puVar1 = (undefined8 *)((long)(local_e8.m_data)->m_floats + lVar17);
                  uVar12 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pcVar16->m_floats + lVar17);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar12;
                  lVar17 = lVar17 + 0x10;
                } while ((long)local_e8.m_size * 0x10 != lVar17);
              }
              if ((local_e8.m_data != (cbtVector3 *)0x0) && (local_e8.m_ownsMemory == true)) {
                cbtAlignedFreeInternal(local_e8.m_data);
              }
              local_e8.m_ownsMemory = true;
              local_e8.m_capacity = iVar15;
              local_e8.m_data = pcVar16;
            }
          }
          pcVar16 = local_e8.m_data + local_e8.m_size;
          pcVar16->m_floats[0] = 0.0;
          pcVar16->m_floats[1] = 0.0;
          pcVar16->m_floats[2] = 0.0;
          pcVar16->m_floats[3] = 0.0;
          local_e8.m_size = local_e8.m_size + 1;
          local_ac = *(float *)&pcVar5[1].field_0xc * *(float *)&pcVar5->field_0x1c + 1.1920929e-07;
        }
        else {
          local_ac = 1.1920929e-07;
        }
        if (local_e8.m_size != 0) {
          local_c8->m_manifoldPtr = *(cbtPersistentManifold **)(local_a8._0_8_ + 0x68);
          if (0 < local_e8.m_size) {
            lVar17 = 8;
            lVar20 = 0;
            do {
              pcVar6 = body0Wrap->m_worldTransform;
              uVar3 = *(uint *)((long)(local_e8.m_data)->m_floats + lVar17 + -8);
              fVar22 = *(float *)((long)(local_e8.m_data)->m_floats + lVar17 + -4);
              auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * (pcVar6->m_basis).m_el[0].m_floats[1]
                                                     )),ZEXT416(uVar3),
                                       ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
              uVar4 = *(uint *)((long)(local_e8.m_data)->m_floats + lVar17);
              auVar9 = vfmadd231ss_fma(auVar9,ZEXT416(uVar4),
                                       ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
              auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * (pcVar6->m_basis).m_el[1].m_floats
                                                                [1])),ZEXT416(uVar3),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[0]));
              auVar10 = vfmadd231ss_fma(auVar10,ZEXT416(uVar4),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
              auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * (pcVar6->m_basis).m_el[2].m_floats
                                                                [1])),ZEXT416(uVar3),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
              auVar11 = vfmadd231ss_fma(auVar11,ZEXT416(uVar4),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
              fVar22 = auVar9._0_4_ + (pcVar6->m_origin).m_floats[0];
              fVar23 = auVar10._0_4_ + (pcVar6->m_origin).m_floats[1];
              fVar8 = auVar11._0_4_ + (pcVar6->m_origin).m_floats[2];
              pcVar6 = triBodyWrap->m_worldTransform;
              local_a8 = ZEXT416((uint)fVar22);
              fVar22 = fVar22 - (pcVar6->m_origin).m_floats[0];
              local_58 = ZEXT416((uint)fVar23);
              fVar23 = fVar23 - (pcVar6->m_origin).m_floats[1];
              local_78 = ZEXT416((uint)fVar8);
              fVar8 = fVar8 - (pcVar6->m_origin).m_floats[2];
              auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (pcVar6->m_basis).m_el[1].m_floats[0]
                                                     )),ZEXT416((uint)fVar22),
                                       ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
              auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar8),
                                       ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
              auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (pcVar6->m_basis).m_el[1].m_floats
                                                                [1])),ZEXT416((uint)fVar22),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[1]));
              auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar8),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[1]));
              auVar9 = vinsertps_avx(auVar9,auVar10,0x10);
              auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (pcVar6->m_basis).m_el[1].m_floats
                                                                [2])),ZEXT416((uint)fVar22),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
              auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar8),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
              local_68.m_floats = (cbtScalar  [4])vinsertps_avx(auVar9,auVar10,0x28);
              bVar14 = cbtSdfCollisionShape::queryPoint(local_90,&local_68,&local_ec,&local_bc);
              if (bVar14 && local_ec <= local_ac) {
                auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_bc.m_floats[1] * local_bc.m_floats[1])
                                                ),ZEXT416((uint)local_bc.m_floats[0]),
                                         ZEXT416((uint)local_bc.m_floats[0]));
                auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_bc.m_floats[2]),
                                         ZEXT416((uint)local_bc.m_floats[2]),auVar9);
                fVar22 = auVar9._0_4_;
                if (1.4210855e-14 <= fVar22) {
                  if (fVar22 < 0.0) {
                    fVar22 = sqrtf(fVar22);
                  }
                  else {
                    auVar9 = vsqrtss_avx(auVar9,auVar9);
                    fVar22 = auVar9._0_4_;
                  }
                  cVar13.m_floats = local_bc.m_floats;
                  fVar23 = local_78._0_4_;
                  fVar22 = 1.0 / fVar22;
                  local_bc.m_floats[1] = fVar22 * local_bc.m_floats[1];
                  local_bc.m_floats[0] = fVar22 * local_bc.m_floats[0];
                  local_bc.m_floats[2] = cVar13.m_floats[2];
                  local_bc.m_floats[3] = cVar13.m_floats[3];
                  local_bc.m_floats[2] = fVar22 * local_bc.m_floats[2];
                }
                else {
                  local_bc.m_floats = SUB6416(ZEXT464(0x3f800000),0);
                  fVar23 = (float)local_78._0_4_;
                }
                pcVar6 = triBodyWrap->m_worldTransform;
                auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_bc.m_floats[1] *
                                                       (pcVar6->m_basis).m_el[0].m_floats[1])),
                                         ZEXT416((uint)local_bc.m_floats[0]),
                                         ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
                auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)local_bc.m_floats[2]),
                                         ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
                auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_bc.m_floats[1] *
                                                        (pcVar6->m_basis).m_el[1].m_floats[1])),
                                          ZEXT416((uint)local_bc.m_floats[0]),
                                          ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[0]));
                auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_bc.m_floats[2]),
                                          ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
                auVar9 = vinsertps_avx(auVar9,auVar10,0x10);
                auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_bc.m_floats[1] *
                                                        (pcVar6->m_basis).m_el[2].m_floats[1])),
                                          ZEXT416((uint)local_bc.m_floats[0]),
                                          ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
                auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_bc.m_floats[2]),
                                          ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
                _local_88 = vinsertps_avx(auVar9,auVar10,0x28);
                if (pcVar5->m_shapeType == 8) {
                  fVar22 = *(float *)&pcVar5[1].field_0xc * *(float *)&pcVar5->field_0x1c;
                  local_ec = local_ec - fVar22;
                  auVar9 = vinsertps_avx(ZEXT416((uint)((float)local_a8._0_4_ -
                                                       fVar22 * (float)local_88._0_4_)),
                                         ZEXT416((uint)((float)local_58._0_4_ -
                                                       fVar22 * (float)local_88._4_4_)),0x10);
                  fVar23 = fVar23 - fVar22 * fStack_80;
                }
                else {
                  auVar9 = vinsertps_avx(local_a8,ZEXT416((uint)local_58._0_4_),0x10);
                }
                auVar10 = vmovshdup_avx(auVar9);
                auVar9 = vinsertps_avx(ZEXT416((uint)(auVar9._0_4_ -
                                                     local_ec * (float)local_88._0_4_)),
                                       ZEXT416((uint)(auVar10._0_4_ -
                                                     local_ec * (float)local_88._4_4_)),0x10);
                local_40 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar23 - local_ec * fStack_80)),0x28)
                ;
                (*(local_c8->super_Result)._vptr_Result[4])(local_c8,local_88,local_40);
              }
              lVar20 = lVar20 + 1;
              lVar17 = lVar17 + 0x10;
            } while (lVar20 < local_e8.m_size);
          }
          pcVar7 = local_c8->m_manifoldPtr;
          if (pcVar7->m_cachedPoints != 0) {
            pcVar21 = local_c8->m_body0Wrap->m_collisionObject;
            if (pcVar7->m_body0 == pcVar21) {
              pcVar18 = local_c8->m_body1Wrap->m_collisionObject;
            }
            else {
              pcVar18 = pcVar21;
              pcVar21 = local_c8->m_body1Wrap->m_collisionObject;
            }
            cbtPersistentManifold::refreshContactPoints
                      (pcVar7,&pcVar21->m_worldTransform,&pcVar18->m_worldTransform);
          }
        }
        cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_e8);
      }
    }
    else if (pcVar5->m_shapeType < 0x18) {
      (*(local_90->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
      this_00 = (cbtConvexTriangleCallback *)(local_a8._0_8_ + 0x10);
      local_c8->m_manifoldPtr = *(cbtPersistentManifold **)(local_a8._0_8_ + 0x68);
      cbtConvexTriangleCallback::setTimeStepAndCounters
                (this_00,in_XMM0_Da,dispatchInfo,body0Wrap,triBodyWrap,local_c8);
      lVar17 = *(long *)(local_a8._0_8_ + 0x68);
      pcVar21 = triBodyWrap->m_collisionObject;
      *(cbtCollisionObject **)(lVar17 + 0x388) = body0Wrap->m_collisionObject;
      *(cbtCollisionObject **)(lVar17 + 0x390) = pcVar21;
      (*(local_90->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                (local_90,this_00,local_a8._0_8_ + 0x18,local_a8._0_8_ + 0x28);
      pcVar7 = local_c8->m_manifoldPtr;
      if (pcVar7->m_cachedPoints != 0) {
        pcVar21 = local_c8->m_body0Wrap->m_collisionObject;
        if (pcVar7->m_body0 == pcVar21) {
          pcVar18 = local_c8->m_body1Wrap->m_collisionObject;
        }
        else {
          pcVar18 = pcVar21;
          pcVar21 = local_c8->m_body1Wrap->m_collisionObject;
        }
        cbtPersistentManifold::refreshContactPoints
                  (pcVar7,&pcVar21->m_worldTransform,&pcVar18->m_worldTransform);
      }
      *(undefined8 *)(local_a8._0_8_ + 0x38) = 0;
      *(undefined8 *)(local_a8._0_8_ + 0x40) = 0;
    }
  }
  CProfileSample::~CProfileSample(&local_ed);
  return;
}

Assistant:

void cbtConvexConcaveCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	BT_PROFILE("cbtConvexConcaveCollisionAlgorithm::processCollision");

	const cbtCollisionObjectWrapper* convexBodyWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* triBodyWrap = m_isSwapped ? body0Wrap : body1Wrap;

	if (triBodyWrap->getCollisionShape()->isConcave())
	{
		if (triBodyWrap->getCollisionShape()->getShapeType() == SDF_SHAPE_PROXYTYPE)
		{
			cbtSdfCollisionShape* sdfShape = (cbtSdfCollisionShape*)triBodyWrap->getCollisionShape();
			if (convexBodyWrap->getCollisionShape()->isConvex())
			{
				cbtConvexShape* convex = (cbtConvexShape*)convexBodyWrap->getCollisionShape();
				cbtAlignedObjectArray<cbtVector3> queryVertices;

				if (convex->isPolyhedral())
				{
					cbtPolyhedralConvexShape* poly = (cbtPolyhedralConvexShape*)convex;
					for (int v = 0; v < poly->getNumVertices(); v++)
					{
						cbtVector3 vtx;
						poly->getVertex(v, vtx);
						queryVertices.push_back(vtx);
					}
				}
				cbtScalar maxDist = SIMD_EPSILON;

				if (convex->getShapeType() == SPHERE_SHAPE_PROXYTYPE)
				{
					queryVertices.push_back(cbtVector3(0, 0, 0));
					cbtSphereShape* sphere = (cbtSphereShape*)convex;
					maxDist = sphere->getRadius() + SIMD_EPSILON;
				}
				if (queryVertices.size())
				{
					resultOut->setPersistentManifold(m_cbtConvexTriangleCallback.m_manifoldPtr);
					//m_cbtConvexTriangleCallback.m_manifoldPtr->clearManifold();

					cbtPolyhedralConvexShape* poly = (cbtPolyhedralConvexShape*)convex;
					for (int v = 0; v < queryVertices.size(); v++)
					{
						const cbtVector3& vtx = queryVertices[v];
						cbtVector3 vtxWorldSpace = convexBodyWrap->getWorldTransform() * vtx;
						cbtVector3 vtxInSdf = triBodyWrap->getWorldTransform().invXform(vtxWorldSpace);

						cbtVector3 normalLocal;
						cbtScalar dist;
						if (sdfShape->queryPoint(vtxInSdf, dist, normalLocal))
						{
							if (dist <= maxDist)
							{
								normalLocal.safeNormalize();
								cbtVector3 normal = triBodyWrap->getWorldTransform().getBasis() * normalLocal;

								if (convex->getShapeType() == SPHERE_SHAPE_PROXYTYPE)
								{
									cbtSphereShape* sphere = (cbtSphereShape*)convex;
									dist -= sphere->getRadius();
									vtxWorldSpace -= sphere->getRadius() * normal;
								}
								resultOut->addContactPoint(normal, vtxWorldSpace - normal * dist, dist);
							}
						}
					}
					resultOut->refreshContactPoints();
				}
			}
		}
		else
		{
			const cbtConcaveShape* concaveShape = static_cast<const cbtConcaveShape*>(triBodyWrap->getCollisionShape());

			if (convexBodyWrap->getCollisionShape()->isConvex())
			{
				cbtScalar collisionMarginTriangle = concaveShape->getMargin();

				resultOut->setPersistentManifold(m_cbtConvexTriangleCallback.m_manifoldPtr);
				m_cbtConvexTriangleCallback.setTimeStepAndCounters(collisionMarginTriangle, dispatchInfo, convexBodyWrap, triBodyWrap, resultOut);

				m_cbtConvexTriangleCallback.m_manifoldPtr->setBodies(convexBodyWrap->getCollisionObject(), triBodyWrap->getCollisionObject());

				concaveShape->processAllTriangles(&m_cbtConvexTriangleCallback, m_cbtConvexTriangleCallback.getAabbMin(), m_cbtConvexTriangleCallback.getAabbMax());

				resultOut->refreshContactPoints();

				m_cbtConvexTriangleCallback.clearWrapperData();
			}
		}
	}
}